

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::LazyDescriptor::Once(LazyDescriptor *this,ServiceDescriptor *service)

{
  once_flag *control;
  anon_class_16_2_d159f980 *in_RDX;
  ServiceDescriptor *local_18;
  undefined1 *local_10;
  LazyDescriptor *local_8;
  
  local_10 = (undefined1 *)&local_18;
  control = this->once_;
  if (control != (once_flag *)0x0) {
    if ((control->control_).super___atomic_base<unsigned_int>._M_i != 0xdd) {
      local_18 = service;
      local_8 = this;
      absl::lts_20250127::base_internal::
      CallOnceImpl<google::protobuf::internal::LazyDescriptor::Once(google::protobuf::ServiceDescriptor_const*)::__0>
                (&control->control_,(SchedulingMode)&local_10,in_RDX);
    }
  }
  return;
}

Assistant:

void LazyDescriptor::Once(const ServiceDescriptor* service) {
  if (once_) {
    absl::call_once(*once_, [&] {
      auto* file = service->file();
      ABSL_CHECK(file->finished_building_);
      const char* lazy_name = reinterpret_cast<const char*>(once_ + 1);
      descriptor_ =
          file->pool_->CrossLinkOnDemandHelper(lazy_name, false).descriptor();
    });
  }
}